

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O1

int gz_load(gz_state *state,uchar *buf,uint len,uint *have)

{
  ssize_t sVar1;
  int *piVar2;
  char *msg;
  uint uVar3;
  int iVar4;
  
  *have = 0;
  do {
    sVar1 = read(state->fd,buf + *have,(ulong)(len - *have));
    if (sVar1 < 1) break;
    uVar3 = *have + (int)sVar1;
    *have = uVar3;
  } while (uVar3 < len);
  if (sVar1 < 0) {
    piVar2 = __errno_location();
    msg = strerror(*piVar2);
    iVar4 = -1;
    gz_error(state,-1,msg);
  }
  else {
    iVar4 = 0;
    if (sVar1 == 0) {
      state->eof = 1;
    }
  }
  return iVar4;
}

Assistant:

static int gz_load(gz_state *state, unsigned char *buf, unsigned len, unsigned *have) {
    ssize_t ret;

    *have = 0;
    do {
        ret = read(state->fd, buf + *have, len - *have);
        if (ret <= 0)
            break;
        *have += (unsigned)ret;
    } while (*have < len);
    if (ret < 0) {
        gz_error(state, Z_ERRNO, zstrerror());
        return -1;
    }
    if (ret == 0)
        state->eof = 1;
    return 0;
}